

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserColour.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyParserColour::ParseValue
          (PropertyParserColour *this,Property *property,String *value,ParameterMap *param_3)

{
  bool bVar1;
  Variant local_60;
  Colour<unsigned_char,_255,_false> local_34;
  ParameterMap *pPStack_30;
  Colourb colour;
  ParameterMap *param_3_local;
  String *value_local;
  Property *property_local;
  PropertyParserColour *this_local;
  
  pPStack_30 = param_3;
  Colour<unsigned_char,_255,_false>::Colour(&local_34,'\0',0xff);
  bVar1 = ParseColour(&local_34,value);
  if (bVar1) {
    Variant::Variant<Rml::Colour<unsigned_char,255,false>&,void>(&local_60,&local_34);
    Variant::operator=(&property->value,&local_60);
    Variant::~Variant(&local_60);
    property->unit = COLOUR;
  }
  return bVar1;
}

Assistant:

bool PropertyParserColour::ParseValue(Property& property, const String& value, const ParameterMap& /*parameters*/) const
{
	Colourb colour;
	if (!ParseColour(colour, value))
		return false;

	property.value = Variant(colour);
	property.unit = Unit::COLOUR;

	return true;
}